

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O1

void monster_death(monster_conflict *mon,player *p,_Bool stats)

{
  uint32_t *puVar1;
  object *poVar2;
  _Bool _Var3;
  _Bool _Var4;
  object *obj;
  wchar_t local_48;
  wchar_t local_44;
  object *local_40;
  player *local_38;
  
  local_40 = mon->held_obj;
  local_38 = p;
  _Var3 = monster_is_visible((monster *)mon);
  _Var4 = true;
  if (!_Var3) {
    _Var4 = monster_is_unique((monster *)mon);
  }
  if (mon->mimicked_obj != (object *)0x0) {
    square_delete_object(cave,mon->grid,mon->mimicked_obj,true,true);
    mon->mimicked_obj = (object *)0x0;
  }
  if (local_40 == (object *)0x0) {
    local_48 = L'\0';
    local_44 = L'\0';
  }
  else {
    local_44 = L'\0';
    local_48 = L'\0';
    do {
      poVar2 = local_40->next;
      local_40->held_m_idx = 0;
      pile_excise(&mon->held_obj,local_40);
      if (!stats) {
        _Var3 = tval_is_money(local_40);
        if ((_Var3) && (local_40->origin != '\x11')) {
          local_48 = local_48 + L'\x01';
        }
        else {
          _Var3 = tval_is_money(local_40);
          if (((!_Var3) && (local_40->origin < 0x1a)) &&
             ((0x2b03c00U >> (local_40->origin & 0x1f) & 1) != 0)) {
            local_44 = local_44 + L'\x01';
          }
        }
      }
      if (_Var4 == false && !stats) {
        local_40->origin = '\x16';
      }
      drop_near((chunk *)cave,&local_40,L'\0',mon->grid,true,false);
      local_40 = poVar2;
    } while (poVar2 != (object *)0x0);
    local_40 = (object *)0x0;
  }
  mon->held_obj = (object *)0x0;
  if ((_Var4 != false) && (local_44 != L'\0' || local_48 != L'\0')) {
    lore_treasure((monster *)mon,local_44,local_48);
  }
  puVar1 = &local_38->upkeep->redraw;
  *puVar1 = *puVar1 | 0x400000;
  quest_monster_death_check(local_38,(monster *)mon);
  return;
}

Assistant:

void monster_death(struct monster *mon, struct player *p, bool stats)
{
	int dump_item = 0;
	int dump_gold = 0;
	struct object *obj = mon->held_obj;

	bool visible = monster_is_visible(mon) || monster_is_unique(mon);

	/* Delete any mimicked objects */
	if (mon->mimicked_obj) {
		square_delete_object(cave, mon->grid, mon->mimicked_obj, true, true);
		mon->mimicked_obj = NULL;
	}

	/* Drop objects being carried */
	while (obj) {
		struct object *next = obj->next;

		/* Object no longer held */
		obj->held_m_idx = 0;
		pile_excise(&mon->held_obj, obj);

		/* Count it and drop it - refactor once origin is a bitflag */
		if (!stats) {
			if (tval_is_money(obj) && (obj->origin != ORIGIN_STOLEN))
				dump_gold++;
			else if (!tval_is_money(obj) && ((obj->origin == ORIGIN_DROP)
					|| (obj->origin == ORIGIN_DROP_PIT)
					|| (obj->origin == ORIGIN_DROP_VAULT)
					|| (obj->origin == ORIGIN_DROP_SUMMON)
					|| (obj->origin == ORIGIN_DROP_SPECIAL)
					|| (obj->origin == ORIGIN_DROP_BREED)
					|| (obj->origin == ORIGIN_DROP_POLY)
					|| (obj->origin == ORIGIN_DROP_WIZARD)))
				dump_item++;
		}

		/* Change origin if monster is invisible, unless we're in stats mode */
		if (!visible && !stats)
			obj->origin = ORIGIN_DROP_UNKNOWN;

		drop_near(cave, &obj, 0, mon->grid, true, false);
		obj = next;
	}

	/* Forget objects */
	mon->held_obj = NULL;

	/* Take note of any dropped treasure */
	if (visible && (dump_item || dump_gold))
		lore_treasure(mon, dump_item, dump_gold);

	/* Update monster list window */
	p->upkeep->redraw |= PR_MONLIST;

	/* Check if we progressed in or finished a quest */
	quest_monster_death_check(p, mon);
}